

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.h
# Opt level: O0

void av1_merge_rd_stats(RD_STATS *rd_stats_dst,RD_STATS *rd_stats_src)

{
  int iVar1;
  int *in_RSI;
  RD_STATS *in_RDI;
  
  if ((in_RDI->rate == 0x7fffffff) || (*in_RSI == 0x7fffffff)) {
    av1_invalid_rd_stats(in_RDI);
  }
  else {
    if ((long)in_RDI->rate + (long)*in_RSI < 0x7fffffff) {
      iVar1 = in_RDI->rate + *in_RSI;
    }
    else {
      iVar1 = 0x7fffffff;
    }
    in_RDI->rate = iVar1;
    if (in_RDI->zero_rate == 0) {
      in_RDI->zero_rate = in_RSI[1];
    }
    in_RDI->dist = *(long *)(in_RSI + 2) + in_RDI->dist;
    if ((in_RDI->sse < 0x7fffffffffffffff) && (*(long *)(in_RSI + 6) < 0x7fffffffffffffff)) {
      in_RDI->sse = *(long *)(in_RSI + 6) + in_RDI->sse;
    }
    in_RDI->skip_txfm = in_RDI->skip_txfm & *(byte *)(in_RSI + 8);
  }
  return;
}

Assistant:

static inline void av1_merge_rd_stats(RD_STATS *rd_stats_dst,
                                      const RD_STATS *rd_stats_src) {
  if (rd_stats_dst->rate == INT_MAX || rd_stats_src->rate == INT_MAX) {
    // If rd_stats_dst or rd_stats_src has invalid rate, we will make
    // rd_stats_dst invalid.
    av1_invalid_rd_stats(rd_stats_dst);
    return;
  }
  rd_stats_dst->rate = (int)AOMMIN(
      ((int64_t)rd_stats_dst->rate + (int64_t)rd_stats_src->rate), INT_MAX);
  if (!rd_stats_dst->zero_rate)
    rd_stats_dst->zero_rate = rd_stats_src->zero_rate;
  rd_stats_dst->dist += rd_stats_src->dist;
  if (rd_stats_dst->sse < INT64_MAX && rd_stats_src->sse < INT64_MAX) {
    rd_stats_dst->sse += rd_stats_src->sse;
  }
  rd_stats_dst->skip_txfm &= rd_stats_src->skip_txfm;
#if CONFIG_RD_DEBUG
  // This may run into problems when monochrome video is
  // encoded, as there will only be 1 plane
  for (int plane = 0; plane < MAX_MB_PLANE; ++plane) {
    rd_stats_dst->txb_coeff_cost[plane] += rd_stats_src->txb_coeff_cost[plane];
  }
#endif
}